

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O0

int mbedtls_sha512_finish_ret(mbedtls_sha512_context *ctx,uchar *output)

{
  uint64_t uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint64_t low;
  uint64_t high;
  uint used;
  int ret;
  uchar *output_local;
  mbedtls_sha512_context *ctx_local;
  
  uVar2 = (uint)ctx->total[0] & 0x7f;
  uVar6 = uVar2 + 1;
  ctx->buffer[uVar2] = 0x80;
  if (uVar6 < 0x71) {
    memset(ctx->buffer + uVar6,0,(ulong)(0x70 - uVar6));
  }
  else {
    memset(ctx->buffer + uVar6,0,(ulong)(0x80 - uVar6));
    iVar3 = mbedtls_internal_sha512_process(ctx,ctx->buffer);
    if (iVar3 != 0) {
      return iVar3;
    }
    memset(ctx->buffer,0,0x70);
  }
  uVar1 = ctx->total[0];
  lVar5 = ctx->total[1] << 3;
  lVar4 = ctx->total[0] << 3;
  ctx->buffer[0x70] = (uchar)((ulong)lVar5 >> 0x38);
  ctx->buffer[0x71] = (uchar)((ulong)lVar5 >> 0x30);
  ctx->buffer[0x72] = (uchar)((ulong)lVar5 >> 0x28);
  ctx->buffer[0x73] = (uchar)((ulong)lVar5 >> 0x20);
  ctx->buffer[0x74] = (uchar)((ulong)lVar5 >> 0x18);
  ctx->buffer[0x75] = (uchar)((ulong)lVar5 >> 0x10);
  ctx->buffer[0x76] = (uchar)((ulong)lVar5 >> 8);
  ctx->buffer[0x77] = (byte)(uVar1 >> 0x3d) | (byte)lVar5;
  ctx->buffer[0x78] = (uchar)((ulong)lVar4 >> 0x38);
  ctx->buffer[0x79] = (uchar)((ulong)lVar4 >> 0x30);
  ctx->buffer[0x7a] = (uchar)((ulong)lVar4 >> 0x28);
  ctx->buffer[0x7b] = (uchar)((ulong)lVar4 >> 0x20);
  ctx->buffer[0x7c] = (uchar)((ulong)lVar4 >> 0x18);
  ctx->buffer[0x7d] = (uchar)((ulong)lVar4 >> 0x10);
  ctx->buffer[0x7e] = (uchar)((ulong)lVar4 >> 8);
  ctx->buffer[0x7f] = (uchar)lVar4;
  ctx_local._4_4_ = mbedtls_internal_sha512_process(ctx,ctx->buffer);
  if (ctx_local._4_4_ == 0) {
    *output = (uchar)(ctx->state[0] >> 0x38);
    output[1] = (uchar)(ctx->state[0] >> 0x30);
    output[2] = (uchar)(ctx->state[0] >> 0x28);
    output[3] = (uchar)(ctx->state[0] >> 0x20);
    output[4] = (uchar)(ctx->state[0] >> 0x18);
    output[5] = (uchar)(ctx->state[0] >> 0x10);
    output[6] = (uchar)(ctx->state[0] >> 8);
    output[7] = (uchar)ctx->state[0];
    output[8] = (uchar)(ctx->state[1] >> 0x38);
    output[9] = (uchar)(ctx->state[1] >> 0x30);
    output[10] = (uchar)(ctx->state[1] >> 0x28);
    output[0xb] = (uchar)(ctx->state[1] >> 0x20);
    output[0xc] = (uchar)(ctx->state[1] >> 0x18);
    output[0xd] = (uchar)(ctx->state[1] >> 0x10);
    output[0xe] = (uchar)(ctx->state[1] >> 8);
    output[0xf] = (uchar)ctx->state[1];
    output[0x10] = (uchar)(ctx->state[2] >> 0x38);
    output[0x11] = (uchar)(ctx->state[2] >> 0x30);
    output[0x12] = (uchar)(ctx->state[2] >> 0x28);
    output[0x13] = (uchar)(ctx->state[2] >> 0x20);
    output[0x14] = (uchar)(ctx->state[2] >> 0x18);
    output[0x15] = (uchar)(ctx->state[2] >> 0x10);
    output[0x16] = (uchar)(ctx->state[2] >> 8);
    output[0x17] = (uchar)ctx->state[2];
    output[0x18] = (uchar)(ctx->state[3] >> 0x38);
    output[0x19] = (uchar)(ctx->state[3] >> 0x30);
    output[0x1a] = (uchar)(ctx->state[3] >> 0x28);
    output[0x1b] = (uchar)(ctx->state[3] >> 0x20);
    output[0x1c] = (uchar)(ctx->state[3] >> 0x18);
    output[0x1d] = (uchar)(ctx->state[3] >> 0x10);
    output[0x1e] = (uchar)(ctx->state[3] >> 8);
    output[0x1f] = (uchar)ctx->state[3];
    output[0x20] = (uchar)(ctx->state[4] >> 0x38);
    output[0x21] = (uchar)(ctx->state[4] >> 0x30);
    output[0x22] = (uchar)(ctx->state[4] >> 0x28);
    output[0x23] = (uchar)(ctx->state[4] >> 0x20);
    output[0x24] = (uchar)(ctx->state[4] >> 0x18);
    output[0x25] = (uchar)(ctx->state[4] >> 0x10);
    output[0x26] = (uchar)(ctx->state[4] >> 8);
    output[0x27] = (uchar)ctx->state[4];
    output[0x28] = (uchar)(ctx->state[5] >> 0x38);
    output[0x29] = (uchar)(ctx->state[5] >> 0x30);
    output[0x2a] = (uchar)(ctx->state[5] >> 0x28);
    output[0x2b] = (uchar)(ctx->state[5] >> 0x20);
    output[0x2c] = (uchar)(ctx->state[5] >> 0x18);
    output[0x2d] = (uchar)(ctx->state[5] >> 0x10);
    output[0x2e] = (uchar)(ctx->state[5] >> 8);
    output[0x2f] = (uchar)ctx->state[5];
    if (ctx->is384 == 0) {
      output[0x30] = (uchar)(ctx->state[6] >> 0x38);
      output[0x31] = (uchar)(ctx->state[6] >> 0x30);
      output[0x32] = (uchar)(ctx->state[6] >> 0x28);
      output[0x33] = (uchar)(ctx->state[6] >> 0x20);
      output[0x34] = (uchar)(ctx->state[6] >> 0x18);
      output[0x35] = (uchar)(ctx->state[6] >> 0x10);
      output[0x36] = (uchar)(ctx->state[6] >> 8);
      output[0x37] = (uchar)ctx->state[6];
      output[0x38] = (uchar)(ctx->state[7] >> 0x38);
      output[0x39] = (uchar)(ctx->state[7] >> 0x30);
      output[0x3a] = (uchar)(ctx->state[7] >> 0x28);
      output[0x3b] = (uchar)(ctx->state[7] >> 0x20);
      output[0x3c] = (uchar)(ctx->state[7] >> 0x18);
      output[0x3d] = (uchar)(ctx->state[7] >> 0x10);
      output[0x3e] = (uchar)(ctx->state[7] >> 8);
      output[0x3f] = (uchar)ctx->state[7];
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_sha512_finish_ret( mbedtls_sha512_context *ctx,
                               unsigned char output[64] )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned used;
    uint64_t high, low;

    SHA512_VALIDATE_RET( ctx != NULL );
    SHA512_VALIDATE_RET( (unsigned char *)output != NULL );

    /*
     * Add padding: 0x80 then 0x00 until 16 bytes remain for the length
     */
    used = ctx->total[0] & 0x7F;

    ctx->buffer[used++] = 0x80;

    if( used <= 112 )
    {
        /* Enough room for padding + length in current block */
        memset( ctx->buffer + used, 0, 112 - used );
    }
    else
    {
        /* We'll need an extra block */
        memset( ctx->buffer + used, 0, 128 - used );

        if( ( ret = mbedtls_internal_sha512_process( ctx, ctx->buffer ) ) != 0 )
            return( ret );

        memset( ctx->buffer, 0, 112 );
    }

    /*
     * Add message length
     */
    high = ( ctx->total[0] >> 61 )
         | ( ctx->total[1] <<  3 );
    low  = ( ctx->total[0] <<  3 );

    sha512_put_uint64_be( high, ctx->buffer, 112 );
    sha512_put_uint64_be( low,  ctx->buffer, 120 );

    if( ( ret = mbedtls_internal_sha512_process( ctx, ctx->buffer ) ) != 0 )
        return( ret );

    /*
     * Output final state
     */
    sha512_put_uint64_be( ctx->state[0], output,  0 );
    sha512_put_uint64_be( ctx->state[1], output,  8 );
    sha512_put_uint64_be( ctx->state[2], output, 16 );
    sha512_put_uint64_be( ctx->state[3], output, 24 );
    sha512_put_uint64_be( ctx->state[4], output, 32 );
    sha512_put_uint64_be( ctx->state[5], output, 40 );

#if !defined(MBEDTLS_SHA512_NO_SHA384)
    if( ctx->is384 == 0 )
#endif
    {
        sha512_put_uint64_be( ctx->state[6], output, 48 );
        sha512_put_uint64_be( ctx->state[7], output, 56 );
    }

    return( 0 );
}